

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

small_vector<double,_4UL,_0UL,_std::allocator<double>_> * __thiscall
itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::operator=
          (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this,
          small_vector<double,_4UL,_0UL,_std::allocator<double>_> *v)

{
  double *pdVar1;
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *in_RSI;
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *in_RDI;
  pointer p;
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *in_stack_ffffffffffffffe0;
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this_00;
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    clear(in_stack_ffffffffffffffe0);
    size(in_RSI);
    pdVar1 = choose_data(in_RSI,(size_t)in_stack_ffffffffffffffe0);
    in_RDI->m_end = pdVar1;
    in_RDI->m_begin = pdVar1;
    for (this_00 = (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *)in_RSI->m_begin;
        this_00 != (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *)in_RSI->m_end;
        this_00 = (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *)&this_00->m_begin) {
      get_alloc(in_RDI);
      std::allocator_traits<std::allocator<double>>::construct<double,double&>
                ((allocator_type *)this_00,(double *)in_RDI,(double *)0x17a4d6);
      in_RDI->m_end = in_RDI->m_end + 1;
    }
    update_capacity(this_00);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

small_vector& operator=(const small_vector& v)
    {
        if (this == &v)
        {
            // prevent self usurp
            return *this;
        }

        clear();

        m_begin = m_end = choose_data(v.size());

        for (auto p = v.m_begin; p != v.m_end; ++p)
        {
            atraits::construct(get_alloc(), m_end, *p);
            ++m_end;
        }

        update_capacity();

        return *this;
    }